

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

QPalette __thiscall QApplication::palette(QApplication *this,QWidget *w)

{
  Span *pSVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  undefined8 *puVar6;
  long in_FS_OFFSET;
  piter pVar7;
  QPalette QVar8;
  QArrayDataPointer<char> QStack_58;
  piter local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((w != (QWidget *)0x0) && (QApplicationPrivate::widgetPalettes.d != (Data *)0x0)) &&
     ((QApplicationPrivate::widgetPalettes.d)->size != 0)) {
    (*(code *)**(undefined8 **)w)(w);
    pcVar2 = (char *)QMetaObject::className();
    QByteArray::QByteArray((QByteArray *)&QStack_58,pcVar2,-1);
    pVar7 = (piter)QHash<QByteArray,_QPalette>::constFindImpl<QByteArray>
                             (&QApplicationPrivate::widgetPalettes,(QByteArray *)&QStack_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_58);
    if (pVar7.d != (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)0x0 || pVar7.bucket != 0) {
LAB_002bbf08:
      pSVar1 = (pVar7.d)->spans;
      uVar4 = pVar7.bucket >> 7;
      QPalette::QPalette((QPalette *)this,
                         (QPalette *)
                         (pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)pVar7.bucket & 0x7f]].
                          storage.data + 0x18));
      uVar5 = extraout_RDX_00;
      goto LAB_002bbedd;
    }
    local_40 = (piter)QHash<QByteArray,_QPalette>::constBegin(&QApplicationPrivate::widgetPalettes);
    while( true ) {
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)0x0 &&
          local_40.bucket == 0) break;
      pSVar1 = (local_40.d)->spans;
      uVar4 = local_40.bucket >> 7;
      puVar6 = *(undefined8 **)
                (pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)local_40.bucket & 0x7f]].storage.
                 data + 8);
      if (puVar6 == (undefined8 *)0x0) {
        puVar6 = &QByteArray::_empty;
      }
      lVar3 = (**(code **)(*(long *)w + 8))(w,puVar6);
      pVar7 = local_40;
      if (lVar3 != 0) goto LAB_002bbf08;
      QHashPrivate::iterator<QHashPrivate::Node<QByteArray,_QPalette>_>::operator++(&local_40);
    }
  }
  QGuiApplication::palette();
  uVar5 = extraout_RDX;
LAB_002bbedd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  QVar8._8_8_ = uVar5;
  QVar8.d = (QPalettePrivate *)this;
  return QVar8;
}

Assistant:

QPalette QApplication::palette(const QWidget* w)
{
    auto &widgetPalettes = QApplicationPrivate::widgetPalettes;
    if (w && !widgetPalettes.isEmpty()) {
        auto it = widgetPalettes.constFind(w->metaObject()->className());
        const auto cend = widgetPalettes.constEnd();
        if (it != cend)
            return *it;
        for (it = widgetPalettes.constBegin(); it != cend; ++it) {
            if (w->inherits(it.key()))
                return it.value();
        }
    }
    return palette();
}